

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_interfaces.cpp
# Opt level: O2

uint32_t spvtools::val::anon_unknown_0::NumConsumedComponents
                   (ValidationState_t *_,Instruction *type)

{
  uint uVar1;
  uint32_t uVar2;
  AddressingModel AVar3;
  StorageClass SVar4;
  Instruction *type_00;
  
  do {
    switch((type->inst_).opcode) {
    case 0x15:
    case 0x16:
      uVar1 = Instruction::GetOperandAs<unsigned_int>(type,1);
      return (uVar1 == 0x40) + 1;
    case 0x17:
      uVar1 = Instruction::GetOperandAs<unsigned_int>(type,1);
      type_00 = ValidationState_t::FindDef(_,uVar1);
      uVar2 = NumConsumedComponents(_,type_00);
      uVar1 = Instruction::GetOperandAs<unsigned_int>(type,2);
      return uVar1 * uVar2;
    default:
      return 0;
    case 0x1c:
      uVar1 = Instruction::GetOperandAs<unsigned_int>(type,1);
      type = ValidationState_t::FindDef(_,uVar1);
      break;
    case 0x20:
      AVar3 = ValidationState_t::addressing_model(_);
      if (AVar3 != AddressingModelPhysicalStorageBuffer64) {
        return 0;
      }
      SVar4 = Instruction::GetOperandAs<spv::StorageClass>(type,1);
      return (uint)(SVar4 == PhysicalStorageBuffer) * 2;
    }
  } while( true );
}

Assistant:

uint32_t NumConsumedComponents(ValidationState_t& _, const Instruction* type) {
  uint32_t num_components = 0;
  switch (type->opcode()) {
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      // 64-bit types consume two components.
      if (type->GetOperandAs<uint32_t>(1) == 64) {
        num_components = 2;
      } else {
        num_components = 1;
      }
      break;
    case spv::Op::OpTypeVector:
      // Vectors consume components equal to the underlying type's consumption
      // times the number of elements in the vector. Note that 3- and 4-element
      // vectors cannot have a component decoration (i.e. assumed to be zero).
      num_components =
          NumConsumedComponents(_, _.FindDef(type->GetOperandAs<uint32_t>(1)));
      num_components *= type->GetOperandAs<uint32_t>(2);
      break;
    case spv::Op::OpTypeArray:
      // Skip the array.
      return NumConsumedComponents(_,
                                   _.FindDef(type->GetOperandAs<uint32_t>(1)));
    case spv::Op::OpTypePointer:
      if (_.addressing_model() ==
              spv::AddressingModel::PhysicalStorageBuffer64 &&
          type->GetOperandAs<spv::StorageClass>(1) ==
              spv::StorageClass::PhysicalStorageBuffer) {
        return 2;
      }
      break;
    default:
      // This is an error that is validated elsewhere.
      break;
  }

  return num_components;
}